

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

char * luaL_optlstring(lua_State *L,int arg,char *def,size_t *len)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  
  iVar1 = lua_type(L,arg);
  if (0 < iVar1) {
    pcVar2 = luaL_checklstring(L,arg,len);
    return pcVar2;
  }
  if (len != (size_t *)0x0) {
    if (def == (char *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = strlen(def);
    }
    *len = sVar3;
  }
  return def;
}

Assistant:

LUALIB_API const char *luaL_optlstring (lua_State *L, int arg,
                                        const char *def, size_t *len) {
  if (lua_isnoneornil(L, arg)) {
    if (len)
      *len = (def ? strlen(def) : 0);
    return def;
  }
  else return luaL_checklstring(L, arg, len);
}